

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

void __thiscall HighsLp::exactResize(HighsLp *this)

{
  std::vector<double,_std::allocator<double>_>::resize(&this->col_cost_,(long)this->num_col_);
  std::vector<double,_std::allocator<double>_>::resize(&this->col_lower_,(long)this->num_col_);
  std::vector<double,_std::allocator<double>_>::resize(&this->col_upper_,(long)this->num_col_);
  std::vector<double,_std::allocator<double>_>::resize(&this->row_lower_,(long)this->num_row_);
  std::vector<double,_std::allocator<double>_>::resize(&this->row_upper_,(long)this->num_row_);
  HighsSparseMatrix::exactResize(&this->a_matrix_);
  if (((long)(this->col_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->col_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start & 0x1fffffffe0U) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->col_names_,(long)this->num_col_);
  }
  if (((long)(this->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start & 0x1fffffffe0U) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->row_names_,(long)this->num_row_);
  }
  if (*(int *)&(this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
               _M_impl.super__Vector_impl_data._M_finish !=
      *(int *)&(this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
               _M_impl.super__Vector_impl_data._M_start) {
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
              (&this->integrality_,(long)this->num_col_);
    return;
  }
  return;
}

Assistant:

void HighsLp::exactResize() {
  this->col_cost_.resize(this->num_col_);
  this->col_lower_.resize(this->num_col_);
  this->col_upper_.resize(this->num_col_);
  this->row_lower_.resize(this->num_row_);
  this->row_upper_.resize(this->num_row_);
  this->a_matrix_.exactResize();

  if ((int)this->col_names_.size()) this->col_names_.resize(this->num_col_);
  if ((int)this->row_names_.size()) this->row_names_.resize(this->num_row_);
  if ((int)this->integrality_.size()) this->integrality_.resize(this->num_col_);
}